

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O2

void __thiscall RNG::~RNG(RNG *this)

{
  std::random_device::~random_device(&this->_rd);
  std::_Function_base::~_Function_base
            (&(this->_generate_mark)._overflow_callback.super__Function_base);
  return;
}

Assistant:

int generate(int from, int to)
    {
        Bench::Probe probe(_generate_mark);

		std::uniform_int_distribution<int> dist(from, to);
        return dist(_rd);
    }